

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::render::button(cvui_block_t *theBlock,int theState,Rect *theShape,String *theLabel)

{
  Scalar_<double> local_110;
  Rect_<int> local_f0;
  _InputOutputArray local_e0;
  Scalar_<double> local_c8;
  Rect_<int> local_a8;
  _InputOutputArray local_98;
  Scalar_<double> local_80;
  Rect_<int> local_50;
  _InputOutputArray local_40;
  String *local_28;
  String *theLabel_local;
  Rect *theShape_local;
  cvui_block_t *pcStack_10;
  int theState_local;
  cvui_block_t *theBlock_local;
  
  local_28 = theLabel;
  theLabel_local = (String *)theShape;
  theShape_local._4_4_ = theState;
  pcStack_10 = theBlock;
  cv::_InputOutputArray::_InputOutputArray(&local_40,&theBlock->where);
  cv::Rect_<int>::Rect_(&local_50,(Rect_<int> *)theLabel_local);
  cv::Scalar_<double>::Scalar_(&local_80,41.0,41.0,41.0,0.0);
  cv::rectangle(&local_40,&local_50,&local_80,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_40);
  *(int *)theLabel_local = *(int *)theLabel_local + 1;
  *(int *)&theLabel_local->field_0x4 = *(int *)&theLabel_local->field_0x4 + 1;
  *(int *)&theLabel_local->_M_string_length = (int)theLabel_local->_M_string_length + -2;
  *(int *)((long)&theLabel_local->_M_string_length + 4) =
       *(int *)((long)&theLabel_local->_M_string_length + 4) + -2;
  cv::_InputOutputArray::_InputOutputArray(&local_98,&pcStack_10->where);
  cv::Rect_<int>::Rect_(&local_a8,(Rect_<int> *)theLabel_local);
  cv::Scalar_<double>::Scalar_(&local_c8,74.0,74.0,74.0,0.0);
  cv::rectangle(&local_98,&local_a8,&local_c8,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_98);
  *(int *)theLabel_local = *(int *)theLabel_local + 1;
  *(int *)&theLabel_local->field_0x4 = *(int *)&theLabel_local->field_0x4 + 1;
  *(int *)&theLabel_local->_M_string_length = (int)theLabel_local->_M_string_length + -2;
  *(int *)((long)&theLabel_local->_M_string_length + 4) =
       *(int *)((long)&theLabel_local->_M_string_length + 4) + -2;
  cv::_InputOutputArray::_InputOutputArray(&local_e0,&pcStack_10->where);
  cv::Rect_<int>::Rect_(&local_f0,(Rect_<int> *)theLabel_local);
  if (theShape_local._4_4_ == 5) {
    cv::Scalar_<double>::Scalar_(&local_110,66.0,66.0,66.0,0.0);
  }
  else if (theShape_local._4_4_ == 4) {
    cv::Scalar_<double>::Scalar_(&local_110,82.0,82.0,82.0,0.0);
  }
  else {
    cv::Scalar_<double>::Scalar_(&local_110,50.0,50.0,50.0,0.0);
  }
  cv::rectangle(&local_e0,&local_f0,&local_110,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_e0);
  return;
}

Assistant:

void button(cvui_block_t& theBlock, int theState, cv::Rect& theShape, const cv::String& theLabel) {
		// Outline
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x29, 0x29, 0x29));

		// Border
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Inside
		theShape.x++; theShape.y++; theShape.width -= 2; theShape.height -= 2;
		cv::rectangle(theBlock.where, theShape, theState == OUT ? cv::Scalar(0x42, 0x42, 0x42) : (theState == OVER ? cv::Scalar(0x52, 0x52, 0x52) : cv::Scalar(0x32, 0x32, 0x32)), CVUI_FILLED);
	}